

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprTermOffsetInit(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  long *plVar2;
  TermOffset *pT;
  int rc;
  int iPos;
  char *pList;
  int iTerm;
  int nTerm;
  TermOffsetCtx *p;
  void *ctx_local;
  Fts3Expr *pFStack_10;
  int iPhrase_local;
  Fts3Expr *pExpr_local;
  
  pT._4_4_ = 0;
  _iTerm = ctx;
  p = (TermOffsetCtx *)ctx;
  ctx_local._4_4_ = iPhrase;
  pFStack_10 = pExpr;
  pT._0_4_ = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),(char **)&rc);
  pList._4_4_ = pFStack_10->pPhrase->nToken;
  if (_rc != (char *)0x0) {
    fts3GetDeltaPosition((char **)&rc,(int *)((long)&pT + 4));
  }
  for (pList._0_4_ = 0; (int)pList < pList._4_4_; pList._0_4_ = (int)pList + 1) {
    iVar1 = *(int *)((long)_iTerm + 0xc);
    *(int *)((long)_iTerm + 0xc) = iVar1 + 1;
    plVar2 = (long *)(*(long *)((long)_iTerm + 0x18) + (long)iVar1 * 0x10);
    *(int *)((long)plVar2 + 0xc) = (pList._4_4_ - (int)pList) + -1;
    *plVar2 = (long)_rc;
    *(undefined4 *)(plVar2 + 1) = pT._4_4_;
  }
  return (int)pT;
}

Assistant:

static int fts3ExprTermOffsetInit(Fts3Expr *pExpr, int iPhrase, void *ctx){
  TermOffsetCtx *p = (TermOffsetCtx *)ctx;
  int nTerm;                      /* Number of tokens in phrase */
  int iTerm;                      /* For looping through nTerm phrase terms */
  char *pList;                    /* Pointer to position list for phrase */
  int iPos = 0;                   /* First position in position-list */
  int rc;

  UNUSED_PARAMETER(iPhrase);
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pList);
  nTerm = pExpr->pPhrase->nToken;
  if( pList ){
    fts3GetDeltaPosition(&pList, &iPos);
    assert_fts3_nc( iPos>=0 );
  }

  for(iTerm=0; iTerm<nTerm; iTerm++){
    TermOffset *pT = &p->aTerm[p->iTerm++];
    pT->iOff = nTerm-iTerm-1;
    pT->pList = pList;
    pT->iPos = iPos;
  }

  return rc;
}